

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QStringList * __thiscall
QCommandLineParser::values
          (QStringList *__return_storage_ptr__,QCommandLineParser *this,QString *optionName)

{
  QCommandLineParserPrivate *pQVar1;
  Span *pSVar2;
  ulong uVar3;
  QStringList *values;
  QCommandLineOption *this_00;
  long in_FS_OFFSET;
  const_iterator cVar4;
  qsizetype optionOffset;
  QArrayDataPointer<QString> local_40;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QHash<QString,_long_long>::constFindImpl<QString>(&this->d->nameHash,optionName);
  if (cVar4.i.d == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 && cVar4.i.bucket == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    pQVar1 = this->d;
    pSVar2 = (cVar4.i.d)->spans;
    uVar3 = cVar4.i.bucket >> 7;
    local_28 = *(long *)(pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)cVar4.i.bucket & 0x7f]].
                         storage.data + 0x18);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<long_long,_QList<QString>_>::value
              (__return_storage_ptr__,&pQVar1->optionValuesHash,&local_28);
    if ((__return_storage_ptr__->d).size == 0) {
      this_00 = (this->d->commandLineOptionList).d.ptr + local_28;
      QCommandLineOption::valueName((QString *)&local_40,this_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
      QCommandLineOption::defaultValues((QStringList *)&local_40,this_00);
      QArrayDataPointer<QString>::operator=(&__return_storage_ptr__->d,&local_40);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCommandLineParser::values(const QString &optionName) const
{
    d->checkParsed("values");
    auto it = d->nameHash.constFind(optionName);
    if (it != d->nameHash.cend()) {
        const qsizetype optionOffset = *it;
        QStringList values = d->optionValuesHash.value(optionOffset);
        if (values.isEmpty()) {
            const auto &option = d->commandLineOptionList.at(optionOffset);
            if (option.valueName().isEmpty()) {
                qWarning("QCommandLineParser: option not expecting values: \"%ls\"",
                         qUtf16Printable(optionName));
            }
            values = option.defaultValues();
        }
        return values;
    }

    qWarning("QCommandLineParser: option not defined: \"%ls\"", qUtf16Printable(optionName));
    return QStringList();
}